

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint16_t mipsdsp_sat_add_u16(uint16_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  undefined2 local_1a;
  uint32_t temp;
  uint16_t result;
  CPUMIPSState_conflict5 *env_local;
  uint16_t b_local;
  uint16_t a_local;
  
  local_1a = (uint16_t)((uint)a + (uint)b);
  if (((uint)a + (uint)b & 0x10000) != 0) {
    local_1a = 0xffff;
    set_DSPControl_overflow_flag(1,0x14,env);
  }
  return local_1a;
}

Assistant:

static inline uint16_t mipsdsp_sat_add_u16(uint16_t a, uint16_t b,
                                           CPUMIPSState *env)
{
    uint16_t result;
    uint32_t temp;

    temp = (uint32_t)a + (uint32_t)b;
    result = temp & 0xFFFF;

    if (0x00010000 & temp) {
        result = 0xFFFF;
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return result;
}